

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMap.hpp
# Opt level: O0

void MultiMap<long,_Server::Private::TimerImpl_*>::rotr(Item **cell)

{
  Item *this;
  Item *this_00;
  Item *pIVar1;
  Item *tmp;
  Item *result;
  Item *oldTop;
  Item **cell_local;
  
  this = *cell;
  this_00 = this->left;
  pIVar1 = this_00->right;
  this_00->parent = this->parent;
  this_00->right = this;
  this->left = pIVar1;
  if (pIVar1 != (Item *)0x0) {
    pIVar1->parent = this;
  }
  this->parent = this_00;
  *cell = this_00;
  Item::updateHeightAndSlope(this);
  Item::updateHeightAndSlope(this_00);
  return;
}

Assistant:

static void rotr(Item*& cell)
  {
    Item* oldTop = cell;
    Item* result = oldTop->left;
    Item* tmp = result->right;
    result->parent = oldTop->parent;
    result->right = oldTop;
    if((oldTop->left = tmp))
      tmp->parent = oldTop;
    oldTop->parent = result;
    cell = result;
    oldTop->updateHeightAndSlope();
    result->updateHeightAndSlope();
  }